

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v1.cpp
# Opt level: O2

void __thiscall intel_acbp_v1_t::ibbs_body_t::_read(ibbs_body_t *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  hash_t *phVar1;
  vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>>>
  *this_01;
  uint8_t uVar2;
  uint32_t uVar3;
  pointer __p;
  pointer __p_00;
  uint64_t uVar4;
  hash_t *phVar5;
  pointer __p_01;
  tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  this_02;
  pointer *__ptr;
  int iVar6;
  uint uVar7;
  bool bVar8;
  __uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_38;
  
  __p_00 = (pointer)operator_new(0x18);
  (__p_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    )0x0;
  std::
  __uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)&this->m_reserved,__p_00);
  std::
  unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)&local_38);
  iVar6 = 3;
  while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
    this_00 = (this->m_reserved)._M_t.
              super___uniq_ptr_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>
              ._M_head_impl;
    uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    local_38._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>.
    _M_head_impl._0_1_ = uVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,(uchar *)&local_38);
  }
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_flags = uVar3;
  uVar4 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_mch_bar = uVar4;
  uVar4 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_vtd_bar = uVar4;
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_dma_protection_base0 = uVar3;
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_dma_protection_limit0 = uVar3;
  uVar4 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_dma_protection_base1 = uVar4;
  uVar4 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_dma_protection_limit1 = uVar4;
  phVar5 = (hash_t *)operator_new(0x48);
  hash_t::hash_t(phVar5,(this->super_kstruct).m__io,&this->super_kstruct,this->m__root);
  phVar1 = (this->m_post_ibb_hash)._M_t.
           super___uniq_ptr_impl<intel_acbp_v1_t::hash_t,_std::default_delete<intel_acbp_v1_t::hash_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v1_t::hash_t_*,_std::default_delete<intel_acbp_v1_t::hash_t>_>
           .super__Head_base<0UL,_intel_acbp_v1_t::hash_t_*,_false>._M_head_impl;
  (this->m_post_ibb_hash)._M_t.
  super___uniq_ptr_impl<intel_acbp_v1_t::hash_t,_std::default_delete<intel_acbp_v1_t::hash_t>_>._M_t
  .super__Tuple_impl<0UL,_intel_acbp_v1_t::hash_t_*,_std::default_delete<intel_acbp_v1_t::hash_t>_>.
  super__Head_base<0UL,_intel_acbp_v1_t::hash_t_*,_false>._M_head_impl = phVar5;
  if (phVar1 != (hash_t *)0x0) {
    (**(code **)((long)(phVar1->super_kstruct)._vptr_kstruct + 8))();
  }
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_ibb_entry_point = uVar3;
  phVar5 = (hash_t *)operator_new(0x48);
  hash_t::hash_t(phVar5,(this->super_kstruct).m__io,&this->super_kstruct,this->m__root);
  phVar1 = (this->m_ibb_hash)._M_t.
           super___uniq_ptr_impl<intel_acbp_v1_t::hash_t,_std::default_delete<intel_acbp_v1_t::hash_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v1_t::hash_t_*,_std::default_delete<intel_acbp_v1_t::hash_t>_>
           .super__Head_base<0UL,_intel_acbp_v1_t::hash_t_*,_false>._M_head_impl;
  (this->m_ibb_hash)._M_t.
  super___uniq_ptr_impl<intel_acbp_v1_t::hash_t,_std::default_delete<intel_acbp_v1_t::hash_t>_>._M_t
  .super__Tuple_impl<0UL,_intel_acbp_v1_t::hash_t_*,_std::default_delete<intel_acbp_v1_t::hash_t>_>.
  super__Head_base<0UL,_intel_acbp_v1_t::hash_t_*,_false>._M_head_impl = phVar5;
  if (phVar1 != (hash_t *)0x0) {
    (**(code **)((long)(phVar1->super_kstruct)._vptr_kstruct + 8))();
  }
  uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_num_ibb_segments = uVar2;
  __p_01 = (pointer)operator_new(0x18);
  (__p_01->
  super__Vector_base<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_01->
  super__Vector_base<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_01->
  super__Vector_base<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    )0x0;
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>_>_>
           *)&this->m_ibb_segments,__p_01);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>_>_>
                 *)&local_38);
  uVar7 = (uint)this->m_num_ibb_segments;
  while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
    this_01 = (vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>>>
               *)(this->m_ibb_segments)._M_t.
                 super___uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>_>_>_*,_false>
                 ._M_head_impl;
    this_02.
    super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    )operator_new(0x30);
    ibb_segment_t::ibb_segment_t
              ((ibb_segment_t *)
               this_02.
               super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>
               ._M_head_impl,(this->super_kstruct).m__io,this,this->m__root);
    local_38._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    )(tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      )this_02.
                       super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>
                       ._M_head_impl;
    std::
    vector<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>>>
    ::
    emplace_back<std::unique_ptr<intel_acbp_v1_t::ibb_segment_t,std::default_delete<intel_acbp_v1_t::ibb_segment_t>>>
              (this_01,(unique_ptr<intel_acbp_v1_t::ibb_segment_t,_std::default_delete<intel_acbp_v1_t::ibb_segment_t>_>
                        *)&local_38);
    if ((_Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         )local_38._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          .
          super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>
          ._M_head_impl != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_t.
                            super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            .
                            super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  return;
}

Assistant:

void intel_acbp_v1_t::ibbs_body_t::_read() {
    m_reserved = std::unique_ptr<std::vector<uint8_t>>(new std::vector<uint8_t>());
    const int l_reserved = 3;
    for (int i = 0; i < l_reserved; i++) {
        m_reserved->push_back(std::move(m__io->read_u1()));
    }
    m_flags = m__io->read_u4le();
    m_mch_bar = m__io->read_u8le();
    m_vtd_bar = m__io->read_u8le();
    m_dma_protection_base0 = m__io->read_u4le();
    m_dma_protection_limit0 = m__io->read_u4le();
    m_dma_protection_base1 = m__io->read_u8le();
    m_dma_protection_limit1 = m__io->read_u8le();
    m_post_ibb_hash = std::unique_ptr<hash_t>(new hash_t(m__io, this, m__root));
    m_ibb_entry_point = m__io->read_u4le();
    m_ibb_hash = std::unique_ptr<hash_t>(new hash_t(m__io, this, m__root));
    m_num_ibb_segments = m__io->read_u1();
    m_ibb_segments = std::unique_ptr<std::vector<std::unique_ptr<ibb_segment_t>>>(new std::vector<std::unique_ptr<ibb_segment_t>>());
    const int l_ibb_segments = num_ibb_segments();
    for (int i = 0; i < l_ibb_segments; i++) {
        m_ibb_segments->push_back(std::move(std::unique_ptr<ibb_segment_t>(new ibb_segment_t(m__io, this, m__root))));
    }
}